

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

void __thiscall TextBuffer::consolidate_layers(TextBuffer *this)

{
  byte bVar1;
  byte bVar2;
  Layer *pLVar3;
  TextBuffer *this_00;
  Layer *layer;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> local_38;
  Layer *local_20;
  
  local_20 = this->top_layer;
  local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Layer **)0x0;
  this_00 = this;
  if (local_20 != (Layer *)0x0) {
    bVar2 = 0;
    do {
      if ((bVar2 == 0) && (local_20->snapshot_count == 0)) {
        if (local_20 == this->base_layer) {
          squash_layers(this_00,&local_38);
          if (local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_38.
                 super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
        }
        if ((local_20->text).is_some == true) {
          local_20->uses_patch = false;
        }
        if (local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_20;
          pLVar3 = (Layer *)(local_38.
                             super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1);
          bVar1 = 0;
          goto LAB_00172314;
        }
        this_00 = (TextBuffer *)&local_38;
        std::vector<TextBuffer::Layer*,std::allocator<TextBuffer::Layer*>>::
        _M_realloc_insert<TextBuffer::Layer*const&>
                  ((vector<TextBuffer::Layer*,std::allocator<TextBuffer::Layer*>> *)&local_38,
                   (iterator)
                   local_38.
                   super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_20);
        bVar2 = 0;
      }
      else {
        squash_layers(this_00,&local_38);
        bVar2 = 1;
        pLVar3 = (Layer *)local_38.
                          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar1 = 1;
        if (local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
LAB_00172314:
          bVar2 = bVar1;
          local_38.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = &pLVar3->previous_layer;
        }
      }
      bVar2 = bVar2 & local_20->uses_patch;
      local_20 = local_20->previous_layer;
    } while (local_20 != (Layer *)0x0);
    local_20 = (Layer *)0x0;
  }
  squash_layers(this_00,&local_38);
  if ((Layer *)local_38.
               super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl
               .super__Vector_impl_data._M_start != (Layer *)0x0) {
    operator_delete(local_38.
                    super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextBuffer::consolidate_layers() {
  Layer *layer = top_layer;
  vector<Layer *> mutable_layers;
  bool needed_by_layer_above = false;

  while (layer) {
    if (needed_by_layer_above || layer->snapshot_count > 0) {
      squash_layers(mutable_layers);
      mutable_layers.clear();
      needed_by_layer_above = true;
    } else {
      if (layer == base_layer) {
        squash_layers(mutable_layers);
        mutable_layers.clear();
      }

      if (layer->text) layer->uses_patch = false;
      mutable_layers.push_back(layer);
    }

    if (!layer->uses_patch) needed_by_layer_above = false;
    layer = layer->previous_layer;
  }

  squash_layers(mutable_layers);
}